

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

DbPage * sqlite3PagerLookup(Pager *pPager,Pgno pgno)

{
  sqlite3_pcache_page *pPage_00;
  sqlite3_pcache_page *pPage;
  Pgno pgno_local;
  Pager *pPager_local;
  
  pPage_00 = sqlite3PcacheFetch(pPager->pPCache,pgno,0);
  if (pPage_00 == (sqlite3_pcache_page *)0x0) {
    pPager_local = (Pager *)0x0;
  }
  else {
    pPager_local = (Pager *)sqlite3PcacheFetchFinish(pPager->pPCache,pgno,pPage_00);
  }
  return (DbPage *)pPager_local;
}

Assistant:

SQLITE_PRIVATE DbPage *sqlite3PagerLookup(Pager *pPager, Pgno pgno){
  sqlite3_pcache_page *pPage;
  assert( pPager!=0 );
  assert( pgno!=0 );
  assert( pPager->pPCache!=0 );
  pPage = sqlite3PcacheFetch(pPager->pPCache, pgno, 0);
  assert( pPage==0 || pPager->hasHeldSharedLock );
  if( pPage==0 ) return 0;
  return sqlite3PcacheFetchFinish(pPager->pPCache, pgno, pPage);
}